

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

bool __thiscall
sf::Shader::loadFromStream
          (Shader *this,InputStream *vertexShaderStream,InputStream *geometryShaderStream,
          InputStream *fragmentShaderStream)

{
  bool bVar1;
  ostream *poVar2;
  vector<char,_std::allocator<char>_> fragmentShader;
  vector<char,_std::allocator<char>_> geometryShader;
  vector<char,_std::allocator<char>_> vertexShader;
  _Vector_base<char,_std::allocator<char>_> local_78;
  _Vector_base<char,_std::allocator<char>_> local_58;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = anon_unknown.dwarf_268115::getStreamContents
                    (vertexShaderStream,(vector<char,_std::allocator<char>_> *)&local_38);
  if (bVar1) {
    local_58._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = anon_unknown.dwarf_268115::getStreamContents
                      (geometryShaderStream,(vector<char,_std::allocator<char>_> *)&local_58);
    if (bVar1) {
      local_78._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = anon_unknown.dwarf_268115::getStreamContents
                        (fragmentShaderStream,(vector<char,_std::allocator<char>_> *)&local_78);
      if (bVar1) {
        bVar1 = compile(this,local_38._M_impl.super__Vector_impl_data._M_start,
                        local_58._M_impl.super__Vector_impl_data._M_start,
                        local_78._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"Failed to read fragment shader from stream");
        std::endl<char,std::char_traits<char>>(poVar2);
        bVar1 = false;
      }
      Catch::clara::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_78);
    }
    else {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to read geometry shader from stream");
      std::endl<char,std::char_traits<char>>(poVar2);
      bVar1 = false;
    }
    Catch::clara::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_58);
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to read vertex shader from stream");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = false;
  }
  Catch::clara::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
  return bVar1;
}

Assistant:

bool Shader::loadFromStream(InputStream& vertexShaderStream, InputStream& geometryShaderStream, InputStream& fragmentShaderStream)
{
    // Read the vertex shader code from the stream
    std::vector<char> vertexShader;
    if (!getStreamContents(vertexShaderStream, vertexShader))
    {
        err() << "Failed to read vertex shader from stream" << std::endl;
        return false;
    }

    // Read the geometry shader code from the stream
    std::vector<char> geometryShader;
    if (!getStreamContents(geometryShaderStream, geometryShader))
    {
        err() << "Failed to read geometry shader from stream" << std::endl;
        return false;
    }

    // Read the fragment shader code from the stream
    std::vector<char> fragmentShader;
    if (!getStreamContents(fragmentShaderStream, fragmentShader))
    {
        err() << "Failed to read fragment shader from stream" << std::endl;
        return false;
    }

    // Compile the shader program
    return compile(&vertexShader[0], &geometryShader[0], &fragmentShader[0]);
}